

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O0

_Bool mon_inc_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  stack_type sVar1;
  _Bool _Var2;
  wchar_t local_34;
  wchar_t local_2c;
  wchar_t new_value;
  mon_timed_effect *effect;
  wchar_t local_18;
  wchar_t flag_local;
  wchar_t timer_local;
  wchar_t effect_type_local;
  monster *mon_local;
  
  if (effect_type < L'\0') {
    __assert_fail("effect_type >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0xf4,"_Bool mon_inc_timed(struct monster *, int, int, int)");
  }
  if (L'\t' < effect_type) {
    __assert_fail("effect_type < MON_TMD_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0xf5,"_Bool mon_inc_timed(struct monster *, int, int, int)");
  }
  if (timer < L'\x01') {
    __assert_fail("timer > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0xf6,"_Bool mon_inc_timed(struct monster *, int, int, int)");
  }
  local_18 = timer;
  if ((mon->m_timed[effect_type] == 0) && (timer < L'\x02')) {
    local_18 = L'\x02';
  }
  sVar1 = effects[effect_type].stacking;
  if (sVar1 == STACK_NO) {
    local_2c = (wchar_t)mon->m_timed[effect_type];
    if (local_2c == L'\0') {
      local_2c = local_18;
    }
  }
  else if (sVar1 == STACK_INCR) {
    local_2c = mon->m_timed[effect_type] + local_18;
  }
  else {
    local_2c = timer;
    if (sVar1 == STACK_MAX) {
      if (mon->m_timed[effect_type] < local_18) {
        local_34 = local_18;
      }
      else {
        local_34 = (wchar_t)mon->m_timed[effect_type];
      }
      local_2c = local_34;
    }
  }
  _Var2 = mon_set_timed(mon,effect_type,local_2c,flag);
  return _Var2;
}

Assistant:

bool mon_inc_timed(struct monster *mon, int effect_type, int timer, int flag)
{
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer > 0); /* For negative amounts, we use mon_dec_timed instead */

	struct mon_timed_effect *effect = &effects[effect_type];
	int new_value = timer;

	/* Make it last for a mimimum # of turns if it is a new effect */
	if (mon->m_timed[effect_type] == 0 && timer < MON_INC_MIN_TURNS) {
		timer = MON_INC_MIN_TURNS;
	}

	/* Stack effects correctly */
	switch (effect->stacking) {
		case STACK_NO: {
			new_value = mon->m_timed[effect_type];
			if (new_value == 0) {
				new_value = timer;
			}
			break;
		}

		case STACK_MAX: {
			new_value = MAX(mon->m_timed[effect_type], timer);
			break;
		}

		case STACK_INCR: {
			new_value = mon->m_timed[effect_type] + timer;
			break;
		}
	}

	return mon_set_timed(mon, effect_type, new_value, flag);
}